

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall
cmFileCopier::InstallSymlinkChain(cmFileCopier *this,string *fromFile,string *toFile)

{
  cmCommand *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  string newFromFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string toFilePath;
  string symlinkTarget;
  string fromFilePath;
  
  newFromFile._M_dataplus._M_p = (pointer)&newFromFile.field_2;
  newFromFile._M_string_length = 0;
  newFromFile.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetFilenamePath(&toFilePath,toFile);
  do {
    bVar1 = cmsys::SystemTools::ReadSymlink(fromFile,&newFromFile);
    if (!bVar1) {
LAB_00272856:
      std::__cxx11::string::~string((string *)&toFilePath);
      std::__cxx11::string::~string((string *)&newFromFile);
      return !bVar1;
    }
    bVar2 = cmsys::SystemTools::FileIsFullPath(&newFromFile);
    if (!bVar2) {
      cmsys::SystemTools::GetFilenamePath(&fromFilePath,fromFile);
      std::operator+(&local_208,&fromFilePath,"/");
      std::operator+(&symlinkTarget,&local_208,&newFromFile);
      std::__cxx11::string::operator=((string *)&newFromFile,(string *)&symlinkTarget);
      std::__cxx11::string::~string((string *)&symlinkTarget);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&fromFilePath);
    }
    cmsys::SystemTools::GetFilenameName(&symlinkTarget,&newFromFile);
    bVar2 = true;
    if (this->Always == false) {
      fromFilePath._M_dataplus._M_p = (pointer)&fromFilePath.field_2;
      fromFilePath._M_string_length = 0;
      fromFilePath.field_2._M_local_buf[0] = '\0';
      bVar3 = cmsys::SystemTools::ReadSymlink(toFile,&fromFilePath);
      bVar2 = true;
      if (bVar3) {
        _Var4 = std::operator==(&symlinkTarget,&fromFilePath);
        bVar2 = !_Var4;
      }
      std::__cxx11::string::~string((string *)&fromFilePath);
    }
    (*this->_vptr_cmFileCopier[4])(this,toFile,2,(ulong)bVar2);
    if (bVar2 != false) {
      cmsys::SystemTools::RemoveFile(toFile);
      cmsys::SystemTools::MakeDirectory(&toFilePath,(mode_t *)0x0);
      bVar2 = cmSystemTools::CreateSymlink(&symlinkTarget,toFile,(string *)0x0);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fromFilePath);
        poVar5 = std::operator<<((ostream *)&fromFilePath,this->Name);
        poVar5 = std::operator<<(poVar5," cannot create symlink \"");
        poVar5 = std::operator<<(poVar5,(string *)toFile);
        std::operator<<(poVar5,"\".");
        this_00 = &this->FileCommand->super_cmCommand;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(this_00,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fromFilePath);
        std::__cxx11::string::~string((string *)&symlinkTarget);
        goto LAB_00272856;
      }
    }
    std::__cxx11::string::_M_assign((string *)fromFile);
    std::operator+(&local_208,&toFilePath,"/");
    std::operator+(&fromFilePath,&local_208,&symlinkTarget);
    std::__cxx11::string::operator=((string *)toFile,(string *)&fromFilePath);
    std::__cxx11::string::~string((string *)&fromFilePath);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&symlinkTarget);
  } while( true );
}

Assistant:

bool cmFileCopier::InstallSymlinkChain(std::string& fromFile,
                                       std::string& toFile)
{
  std::string newFromFile;
  std::string toFilePath = cmSystemTools::GetFilenamePath(toFile);
  while (cmSystemTools::ReadSymlink(fromFile, newFromFile)) {
    if (!cmSystemTools::FileIsFullPath(newFromFile)) {
      std::string fromFilePath = cmSystemTools::GetFilenamePath(fromFile);
      newFromFile = fromFilePath + "/" + newFromFile;
    }

    std::string symlinkTarget = cmSystemTools::GetFilenameName(newFromFile);

    bool copy = true;
    if (!this->Always) {
      std::string oldSymlinkTarget;
      if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
        if (symlinkTarget == oldSymlinkTarget) {
          copy = false;
        }
      }
    }

    this->ReportCopy(toFile, TypeLink, copy);

    if (copy) {
      cmSystemTools::RemoveFile(toFile);
      cmSystemTools::MakeDirectory(toFilePath);

      if (!cmSystemTools::CreateSymlink(symlinkTarget, toFile)) {
        std::ostringstream e;
        e << this->Name << " cannot create symlink \"" << toFile << "\".";
        this->FileCommand->SetError(e.str());
        return false;
      }
    }

    fromFile = newFromFile;
    toFile = toFilePath + "/" + symlinkTarget;
  }

  return true;
}